

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

xmlElementPtr
xmlAddElementDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *name,xmlElementTypeVal type,
                 xmlElementContentPtr content)

{
  _xmlDtd *p_Var1;
  _xmlNode *p_Var2;
  int iVar3;
  xmlHashTablePtr table;
  xmlElementPtr elem;
  _xmlNode *elem_00;
  xmlChar *pxVar4;
  xmlElementContentPtr pxVar5;
  char *pcVar6;
  _xmlDict *dict;
  xmlChar *ns;
  _xmlNode *local_50;
  xmlValidCtxtPtr local_48;
  _xmlNode *local_40;
  xmlAttributePtr local_38;
  
  if (name == (xmlChar *)0x0 || dtd == (xmlDtdPtr)0x0) {
    return (xmlElementPtr)0x0;
  }
  switch(type) {
  case XML_ELEMENT_TYPE_EMPTY:
    if (content != (xmlElementContentPtr)0x0) {
      pcVar6 = "xmlAddElementDecl: content != NULL for EMPTY\n";
      goto LAB_0018dd57;
    }
    break;
  case XML_ELEMENT_TYPE_ANY:
    if (content != (xmlElementContentPtr)0x0) {
      pcVar6 = "xmlAddElementDecl: content != NULL for ANY\n";
      goto LAB_0018dd57;
    }
    break;
  case XML_ELEMENT_TYPE_MIXED:
    if (content == (xmlElementContentPtr)0x0) {
      pcVar6 = "xmlAddElementDecl: content == NULL for MIXED\n";
      goto LAB_0018dd57;
    }
    break;
  case XML_ELEMENT_TYPE_ELEMENT:
    if (content == (xmlElementContentPtr)0x0) {
      pcVar6 = "xmlAddElementDecl: content == NULL for ELEMENT\n";
      goto LAB_0018dd57;
    }
    break;
  default:
    pcVar6 = "Internal: ELEMENT decl corrupted invalid type\n";
LAB_0018dd57:
    xmlErrValid(ctxt,XML_ERR_INTERNAL_ERROR,pcVar6,(char *)0x0);
    return (xmlElementPtr)0x0;
  }
  local_48 = ctxt;
  local_40 = (_xmlNode *)xmlSplitQName2(name,(xmlChar **)&local_50);
  if (local_40 != (_xmlNode *)0x0) {
    name = (xmlChar *)local_40;
  }
  table = (xmlHashTablePtr)dtd->elements;
  if (table == (xmlHashTablePtr)0x0) {
    if (dtd->doc == (_xmlDoc *)0x0) {
      dict = (xmlDictPtr)0x0;
    }
    else {
      dict = dtd->doc->dict;
    }
    table = xmlHashCreateDict(0,dict);
    dtd->elements = table;
    if (table != (xmlHashTablePtr)0x0) goto LAB_0018dd91;
    pcVar6 = "xmlAddElementDecl: Table creation failed!\n";
LAB_0018df0b:
    xmlVErrMemory(local_48,pcVar6);
  }
  else {
LAB_0018dd91:
    if ((((dtd->doc == (_xmlDoc *)0x0) || (p_Var1 = dtd->doc->intSubset, p_Var1 == (_xmlDtd *)0x0))
        || (elem = (xmlElementPtr)
                   xmlHashLookup2((xmlHashTablePtr)p_Var1->elements,name,(xmlChar *)local_50),
           elem == (xmlElementPtr)0x0)) || (elem->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
      local_38 = (xmlAttributePtr)0x0;
    }
    else {
      local_38 = elem->attributes;
      elem->attributes = (xmlAttributePtr)0x0;
      xmlHashRemoveEntry2((xmlHashTablePtr)dtd->doc->intSubset->elements,name,(xmlChar *)local_50,
                          (xmlHashDeallocator)0x0);
      xmlFreeElement(elem);
    }
    elem_00 = (_xmlNode *)xmlHashLookup2(table,name,(xmlChar *)local_50);
    if (elem_00 == (_xmlNode *)0x0) {
      elem_00 = (_xmlNode *)(*xmlMalloc)(0x70);
      if (elem_00 != (_xmlNode *)0x0) {
        elem_00->_private = (void *)0x0;
        *(undefined8 *)&elem_00->type = 0;
        elem_00->nsDef = (xmlNs *)0x0;
        elem_00->psvi = (void *)0x0;
        elem_00->content = (xmlChar *)0x0;
        elem_00->properties = (_xmlAttr *)0x0;
        elem_00->doc = (_xmlDoc *)0x0;
        elem_00->ns = (xmlNs *)0x0;
        elem_00->next = (_xmlNode *)0x0;
        elem_00->prev = (_xmlNode *)0x0;
        elem_00->last = (_xmlNode *)0x0;
        elem_00->parent = (_xmlNode *)0x0;
        elem_00->name = (xmlChar *)0x0;
        elem_00->children = (_xmlNode *)0x0;
        elem_00->type = XML_ELEMENT_DECL;
        pxVar4 = xmlStrdup(name);
        elem_00->name = pxVar4;
        if (pxVar4 == (xmlChar *)0x0) {
          xmlVErrMemory(local_48,"malloc failed");
          if (local_40 != (_xmlNode *)0x0) {
            (*xmlFree)(local_40);
          }
          if (local_50 != (_xmlNode *)0x0) {
            (*xmlFree)(local_50);
          }
        }
        else {
          elem_00->nsDef = (xmlNs *)local_50;
          iVar3 = xmlHashAddEntry2(table,name,(xmlChar *)local_50,elem_00);
          if (iVar3 == 0) {
            elem_00->properties = (_xmlAttr *)local_38;
            goto LAB_0018dfcf;
          }
          xmlErrValidNode(local_48,(xmlNodePtr)dtd,XML_DTD_ELEM_REDEFINED,
                          "Redefinition of element %s\n",name,(xmlChar *)0x0,(xmlChar *)0x0);
          xmlFreeElement((xmlElementPtr)elem_00);
          elem_00 = local_40;
          if (local_40 == (_xmlNode *)0x0) {
            return (xmlElementPtr)0x0;
          }
        }
        goto LAB_0018df3d;
      }
      pcVar6 = "malloc failed";
      goto LAB_0018df0b;
    }
    if (*(int *)&elem_00->ns == 0) {
      if (local_50 != (_xmlNode *)0x0) {
        (*xmlFree)(local_50);
        local_50 = (_xmlNode *)0x0;
      }
LAB_0018dfcf:
      *(xmlElementTypeVal *)&elem_00->ns = type;
      if ((local_48 == (xmlValidCtxtPtr)0x0) || ((local_48->flags & 2) == 0)) {
        pxVar5 = xmlCopyDocElementContent(dtd->doc,content);
        elem_00->content = (xmlChar *)pxVar5;
      }
      else {
        elem_00->content = (xmlChar *)content;
        if (content != (xmlElementContentPtr)0x0) {
          content->parent = (_xmlElementContent *)&DAT_00000001;
        }
      }
      elem_00->parent = (_xmlNode *)dtd;
      elem_00->doc = dtd->doc;
      p_Var2 = dtd->last;
      if (p_Var2 == (_xmlNode *)0x0) {
        dtd->children = elem_00;
      }
      else {
        p_Var2->next = elem_00;
        elem_00->prev = p_Var2;
      }
      dtd->last = elem_00;
      if (local_40 == (_xmlNode *)0x0) {
        return (xmlElementPtr)elem_00;
      }
      (*xmlFree)(local_40);
      return (xmlElementPtr)elem_00;
    }
    xmlErrValidNode(local_48,(xmlNodePtr)dtd,XML_DTD_ELEM_REDEFINED,"Redefinition of element %s\n",
                    name,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  if (local_40 != (_xmlNode *)0x0) {
    (*xmlFree)(local_40);
  }
  elem_00 = local_50;
  if (local_50 == (_xmlNode *)0x0) {
    return (xmlElementPtr)0x0;
  }
LAB_0018df3d:
  (*xmlFree)(elem_00);
  return (xmlElementPtr)0x0;
}

Assistant:

xmlElementPtr
xmlAddElementDecl(xmlValidCtxtPtr ctxt,
                  xmlDtdPtr dtd, const xmlChar *name,
                  xmlElementTypeVal type,
		  xmlElementContentPtr content) {
    xmlElementPtr ret;
    xmlElementTablePtr table;
    xmlAttributePtr oldAttributes = NULL;
    xmlChar *ns, *uqname;

    if (dtd == NULL) {
	return(NULL);
    }
    if (name == NULL) {
	return(NULL);
    }

    switch (type) {
        case XML_ELEMENT_TYPE_EMPTY:
	    if (content != NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content != NULL for EMPTY\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_ANY:
	    if (content != NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content != NULL for ANY\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_MIXED:
	    if (content == NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content == NULL for MIXED\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_ELEMENT:
	    if (content == NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content == NULL for ELEMENT\n",
			NULL);
		return(NULL);
	    }
	    break;
	default:
	    xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		    "Internal: ELEMENT decl corrupted invalid type\n",
		    NULL);
	    return(NULL);
    }

    /*
     * check if name is a QName
     */
    uqname = xmlSplitQName2(name, &ns);
    if (uqname != NULL)
	name = uqname;

    /*
     * Create the Element table if needed.
     */
    table = (xmlElementTablePtr) dtd->elements;
    if (table == NULL) {
	xmlDictPtr dict = NULL;

	if (dtd->doc != NULL)
	    dict = dtd->doc->dict;
        table = xmlHashCreateDict(0, dict);
	dtd->elements = (void *) table;
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
            "xmlAddElementDecl: Table creation failed!\n");
	if (uqname != NULL)
	    xmlFree(uqname);
	if (ns != NULL)
	    xmlFree(ns);
        return(NULL);
    }

    /*
     * lookup old attributes inserted on an undefined element in the
     * internal subset.
     */
    if ((dtd->doc != NULL) && (dtd->doc->intSubset != NULL)) {
	ret = xmlHashLookup2(dtd->doc->intSubset->elements, name, ns);
	if ((ret != NULL) && (ret->etype == XML_ELEMENT_TYPE_UNDEFINED)) {
	    oldAttributes = ret->attributes;
	    ret->attributes = NULL;
	    xmlHashRemoveEntry2(dtd->doc->intSubset->elements, name, ns, NULL);
	    xmlFreeElement(ret);
	}
    }

    /*
     * The element may already be present if one of its attribute
     * was registered first
     */
    ret = xmlHashLookup2(table, name, ns);
    if (ret != NULL) {
	if (ret->etype != XML_ELEMENT_TYPE_UNDEFINED) {
#ifdef LIBXML_VALID_ENABLED
	    /*
	     * The element is already defined in this DTD.
	     */
	    xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ELEM_REDEFINED,
	                    "Redefinition of element %s\n",
			    name, NULL, NULL);
#endif /* LIBXML_VALID_ENABLED */
	    if (uqname != NULL)
		xmlFree(uqname);
            if (ns != NULL)
	        xmlFree(ns);
	    return(NULL);
	}
	if (ns != NULL) {
	    xmlFree(ns);
	    ns = NULL;
	}
    } else {
	ret = (xmlElementPtr) xmlMalloc(sizeof(xmlElement));
	if (ret == NULL) {
	    xmlVErrMemory(ctxt, "malloc failed");
	    if (uqname != NULL)
		xmlFree(uqname);
            if (ns != NULL)
	        xmlFree(ns);
	    return(NULL);
	}
	memset(ret, 0, sizeof(xmlElement));
	ret->type = XML_ELEMENT_DECL;

	/*
	 * fill the structure.
	 */
	ret->name = xmlStrdup(name);
	if (ret->name == NULL) {
	    xmlVErrMemory(ctxt, "malloc failed");
	    if (uqname != NULL)
		xmlFree(uqname);
            if (ns != NULL)
	        xmlFree(ns);
	    xmlFree(ret);
	    return(NULL);
	}
	ret->prefix = ns;

	/*
	 * Validity Check:
	 * Insertion must not fail
	 */
	if (xmlHashAddEntry2(table, name, ns, ret)) {
#ifdef LIBXML_VALID_ENABLED
	    /*
	     * The element is already defined in this DTD.
	     */
	    xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ELEM_REDEFINED,
	                    "Redefinition of element %s\n",
			    name, NULL, NULL);
#endif /* LIBXML_VALID_ENABLED */
	    xmlFreeElement(ret);
	    if (uqname != NULL)
		xmlFree(uqname);
	    return(NULL);
	}
	/*
	 * For new element, may have attributes from earlier
	 * definition in internal subset
	 */
	ret->attributes = oldAttributes;
    }

    /*
     * Finish to fill the structure.
     */
    ret->etype = type;
    /*
     * Avoid a stupid copy when called by the parser
     * and flag it by setting a special parent value
     * so the parser doesn't unallocate it.
     */
    if ((ctxt != NULL) && (ctxt->flags & XML_VCTXT_USE_PCTXT)) {
	ret->content = content;
	if (content != NULL)
	    content->parent = (xmlElementContentPtr) 1;
    } else {
	ret->content = xmlCopyDocElementContent(dtd->doc, content);
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    ret->doc = dtd->doc;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    if (uqname != NULL)
	xmlFree(uqname);
    return(ret);
}